

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O0

void __thiscall helics::Endpoint::setDefaultDestination(Endpoint *this,string_view target)

{
  string_view newTarget;
  bool bVar1;
  Modes MVar2;
  Interface *in_RDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  pbVar3 = in_RDI;
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31fd76);
  if ((bVar1) && (MVar2 = Federate::getCurrentMode((Federate *)0x31fd91), (char)MVar2 < '\x02')) {
    newTarget._M_str = in_RSI;
    newTarget._M_len = (size_t)pbVar3;
    Interface::addDestinationTarget(in_RDX,newTarget,(InterfaceType)((ulong)in_RSI >> 0x38));
  }
  std::__cxx11::string::operator=(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void Endpoint::setDefaultDestination(std::string_view target)
{
    if (defDest.empty() && fed->getCurrentMode() < Federate::Modes::EXECUTING) {
        addDestinationTarget(target);
    }
    defDest = target;
}